

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.c
# Opt level: O0

UINT64 ByteArrayToUint64(BYTE *a)

{
  UINT64 retVal;
  BYTE *a_local;
  
  return (ulong)a[7] +
         ((ulong)a[6] +
         ((ulong)a[5] +
         ((ulong)a[4] +
         ((ulong)a[3] + ((ulong)a[2] + ((ulong)a[1] + (ulong)*a * 0x100) * 0x100) * 0x100) * 0x100)
         * 0x100) * 0x100) * 0x100;
}

Assistant:

UINT64 ByteArrayToUint64(BYTE* a)
{
    UINT64      retVal;
    retVal  = a[0]; retVal <<= 8;
    retVal += a[1]; retVal <<= 8;
    retVal += a[2]; retVal <<= 8;
    retVal += a[3]; retVal <<= 8;
    retVal += a[4]; retVal <<= 8;
    retVal += a[5]; retVal <<= 8;
    retVal += a[6]; retVal <<= 8;
    retVal += a[7];
    return retVal;
}